

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O1

Matrix3f * Matrix3f::rotateY(Matrix3f *__return_storage_ptr__,float radians)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos((double)radians);
  dVar2 = sin((double)radians);
  __return_storage_ptr__->m_elements[0] = (float)dVar1;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = -(float)dVar2;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 1.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = (float)dVar2;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = (float)dVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::rotateY( float radians )
{
	float c = cos( radians );
	float s = sin( radians );

	return Matrix3f
	(
		c, 0, s,
		0, 1, 0,
		-s, 0, c
	);
}